

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil_rand.c
# Opt level: O0

void evutil_secure_rng_get_bytes(void *buf,size_t n)

{
  size_t n_local;
  void *buf_local;
  
  ev_arc4random_buf(buf,n);
  return;
}

Assistant:

void
evutil_secure_rng_get_bytes(void *buf, size_t n)
{
	ev_arc4random_buf(buf, n);
}